

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O0

void __thiscall
flatbuffers::vector_downward<unsigned_long>::reallocate
          (vector_downward<unsigned_long> *this,size_t len)

{
  unsigned_long *puVar1;
  uint8_t *puVar2;
  ulong local_48;
  ulong local_38;
  size_t local_30;
  unsigned_long old_scratch_size;
  unsigned_long old_size;
  size_t old_reserved;
  size_t len_local;
  vector_downward<unsigned_long> *this_local;
  
  old_size = this->reserved_;
  old_reserved = len;
  len_local = (size_t)this;
  old_scratch_size = size(this);
  local_30 = scratch_size(this);
  if (old_size == 0) {
    local_48 = this->initial_size_;
  }
  else {
    local_48 = old_size >> 1;
  }
  local_38 = local_48;
  puVar1 = std::max<unsigned_long>(&old_reserved,&local_38);
  this->reserved_ = *puVar1 + this->reserved_;
  this->reserved_ =
       (this->reserved_ + this->buffer_minalign_) - 1 &
       (this->buffer_minalign_ - 1 ^ 0xffffffffffffffff);
  if (this->buf_ == (uint8_t *)0x0) {
    puVar2 = Allocate(this->allocator_,this->reserved_);
    this->buf_ = puVar2;
  }
  else {
    puVar2 = ReallocateDownward(this->allocator_,this->buf_,old_size,this->reserved_,
                                old_scratch_size,local_30);
    this->buf_ = puVar2;
  }
  this->cur_ = this->buf_ + (this->reserved_ - old_scratch_size);
  this->scratch_ = this->buf_ + local_30;
  return;
}

Assistant:

void reallocate(size_t len) {
    auto old_reserved = reserved_;
    auto old_size = size();
    auto old_scratch_size = scratch_size();
    reserved_ +=
        (std::max)(len, old_reserved ? old_reserved / 2 : initial_size_);
    reserved_ = (reserved_ + buffer_minalign_ - 1) & ~(buffer_minalign_ - 1);
    if (buf_) {
      buf_ = ReallocateDownward(allocator_, buf_, old_reserved, reserved_,
                                old_size, old_scratch_size);
    } else {
      buf_ = Allocate(allocator_, reserved_);
    }
    cur_ = buf_ + reserved_ - old_size;
    scratch_ = buf_ + old_scratch_size;
  }